

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O0

void __thiscall Wasm::WasmBinaryReader::ReadGlobalSection(WasmBinaryReader *this)

{
  code *pcVar1;
  WasmNode init;
  WasmType WVar2;
  bool bVar3;
  uint lhs;
  uint32 rhs;
  WasmType WVar4;
  WasmGlobal *this_00;
  undefined4 *puVar5;
  WasmType local_50;
  Type local_4c;
  WasmType initType;
  Type refType;
  WasmNode globalNode;
  uint uStack_20;
  bool isMutable;
  WasmType type;
  uint32 i;
  uint32 totalGlobals;
  uint32 numGlobals;
  uint32 len;
  WasmBinaryReader *this_local;
  
  totalGlobals = 0;
  _numGlobals = this;
  lhs = LEB128<unsigned_int,32u>(this,&totalGlobals);
  type = Void;
  i = lhs;
  rhs = Js::WebAssemblyModule::GetGlobalCount(this->m_module);
  bVar3 = UInt32Math::Add(lhs,rhs,&type);
  WVar2 = type;
  if ((bVar3) || (WVar4 = Limits::GetMaxGlobals(), WVar4 < WVar2)) {
    ThrowDecodingError(this,L"Too many globals");
  }
  uStack_20 = 0;
  while( true ) {
    if (i <= uStack_20) {
      return;
    }
    globalNode.field_1._20_4_ = ReadWasmType(this,&totalGlobals);
    bVar3 = WasmTypes::IsLocalType(globalNode.field_1._20_4_);
    if (!bVar3) {
      ThrowDecodingError(this,L"Invalid global type %u",(ulong)(uint)globalNode.field_1._20_4_);
    }
    switch(globalNode.field_1._20_4_) {
    case 1:
      break;
    case 2:
      break;
    case 3:
      break;
    case 4:
      break;
    case 5:
      ThrowDecodingError(this,L"v128 globals not supported");
    default:
      WasmTypes::
      CompileAssertCases<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
                ();
    }
    globalNode.field_1.brTable.defaultTarget._3_1_ = ReadMutableValue(this);
    ReadInitExpr((WasmNode *)&initType,this,false);
    local_4c = Const;
    switch((undefined2)initType) {
    case 0x23:
      this_00 = Js::WebAssemblyModule::GetGlobal(this->m_module,globalNode._0_4_);
      local_50 = WasmGlobal::GetType(this_00);
      local_4c = LocalReference;
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmBinaryReader.cpp"
                         ,0x44f,"((0))","UNREACHED");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
      ThrowDecodingError(this,L"Unknown global init_expr");
    case 0x41:
      local_50 = FirstLocalType;
      break;
    case 0x42:
      local_50 = I64;
      break;
    case 0x43:
      local_50 = F32;
      break;
    case 0x44:
      local_50 = F64;
    }
    if (globalNode.field_1._20_4_ != local_50) break;
    init._2_6_ = stack0xffffffffffffffba;
    init.op = (undefined2)initType;
    init.field_1.block.field_1 = (anon_union_4_2_52a1cc71_for_WasmBlock_1)globalNode._4_4_;
    init.field_1.br.depth = (WasmBrNode)(WasmBrNode)globalNode._0_4_;
    init.field_1._8_8_ = globalNode.field_1.block;
    init.field_1._16_8_ = globalNode.field_1.brTable.targetTable;
    Js::WebAssemblyModule::AddGlobal
              (this->m_module,local_4c,globalNode.field_1._20_4_,
               (bool)(globalNode.field_1.brTable.defaultTarget._3_1_ & 1),init);
    uStack_20 = uStack_20 + 1;
  }
  ThrowDecodingError(this,L"Type mismatch for global initialization");
}

Assistant:

void WasmBinaryReader::ReadGlobalSection()
{
    uint32 len = 0;
    uint32 numGlobals = LEB128(len);

    uint32 totalGlobals = 0;
    if (UInt32Math::Add(numGlobals, m_module->GetGlobalCount(), &totalGlobals) || totalGlobals > Limits::GetMaxGlobals())
    {
        ThrowDecodingError(_u("Too many globals"));
    }

    for (uint32 i = 0; i < numGlobals; ++i)
    {
        WasmTypes::WasmType type = ReadWasmType(len);
        
        if (!WasmTypes::IsLocalType(type))
        {
            ThrowDecodingError(_u("Invalid global type %u"), type);
        }
        switch (type)
        {
        case WasmTypes::I32: break; // Handled
        case WasmTypes::I64: break; // Handled
        case WasmTypes::F32: break; // Handled
        case WasmTypes::F64: break; // Handled
#ifdef ENABLE_WASM_SIMD
        case WasmTypes::V128: ThrowDecodingError(_u("v128 globals not supported"));
#endif
        default:
            WasmTypes::CompileAssertCases<WasmTypes::I32, WasmTypes::I64, WasmTypes::F32, WasmTypes::F64, WASM_V128_CHECK_TYPE>();
        }
        
        bool isMutable = ReadMutableValue();
        WasmNode globalNode = ReadInitExpr();
        GlobalReferenceTypes::Type refType = GlobalReferenceTypes::Const;
        WasmTypes::WasmType initType;

        switch (globalNode.op) {
        case  wbI32Const: initType = WasmTypes::I32; break;
        case  wbF32Const: initType = WasmTypes::F32; break;
        case  wbF64Const: initType = WasmTypes::F64; break;
        case  wbI64Const: initType = WasmTypes::I64; break;
        case  wbGetGlobal:
            initType = m_module->GetGlobal(globalNode.var.num)->GetType();
            refType = GlobalReferenceTypes::LocalReference;
            break;
        default:
            Assert(UNREACHED);
            ThrowDecodingError(_u("Unknown global init_expr"));
        }
        if (type != initType)
        {
            ThrowDecodingError(_u("Type mismatch for global initialization"));
        }
        m_module->AddGlobal(refType, type, isMutable, globalNode);
    }
}